

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O1

void __thiscall
WavingSketch<8U,_1U,_4U>::Check
          (WavingSketch<8U,_1U,_4U> *this,HashMap<4U> *mp,Abstract<4U> *another,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  _Hash_node_base *p_Var8;
  int iVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  p_Var8 = (mp->_M_h)._M_before_begin._M_nxt;
  if (p_Var8 == (_Hash_node_base *)0x0) {
    auVar10 = ZEXT816(0);
    dVar11 = 0.0;
  }
  else {
    auVar10 = ZEXT816(0);
    iVar9 = 0;
    do {
      iVar5 = (*(this->super_Abstract<4U>)._vptr_Abstract[1])(this,p_Var8 + 1,mp);
      iVar6 = (*another->_vptr_Abstract[1])(another,p_Var8 + 1,mp);
      auVar13 = vpinsrd_avx(ZEXT416((uint)(iVar5 - iVar6)),
                            *(undefined4 *)((long)&p_Var8[1]._M_nxt + 4),1);
      auVar13 = vpabsd_avx(auVar13);
      iVar5 = (this->super_Abstract<4U>).HIT;
      auVar12._4_4_ = iVar5;
      auVar12._0_4_ = iVar5;
      auVar12._8_4_ = iVar5;
      auVar12._12_4_ = iVar5;
      uVar4 = vpcmpgtd_avx512vl(auVar13,auVar12);
      iVar9 = iVar9 + (uint)((~((byte)uVar4 & 0xf) & 3) == 0);
      auVar13 = vpcmpgtd_avx(auVar13,auVar12);
      auVar10 = vpsubd_avx(auVar10,auVar13);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
    dVar11 = (double)iVar9;
    auVar10 = vcvtdq2pd_avx(auVar10);
  }
  auVar13._8_8_ = dVar11;
  auVar13._0_8_ = dVar11;
  auVar10 = vdivpd_avx(auVar13,auVar10);
  (this->super_Abstract<4U>).pr = (double)auVar10._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar10._8_8_;
  auVar10 = vshufpd_avx(auVar10,auVar10,1);
  poVar7 = std::ostream::_M_insert<double>(auVar10._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
  poVar7 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
  dVar11 = (this->super_Abstract<4U>).pr;
  dVar1 = (this->super_Abstract<4U>).cr;
  dVar2 = dVar11 + dVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2;
  uVar4 = vcmpsd_avx512f(auVar10,ZEXT816(0x3e112e0be826d695),1);
  bVar3 = (bool)((byte)uVar4 & 1);
  poVar7 = std::ostream::_M_insert<double>
                     (((dVar11 + dVar11) * dVar1) /
                      (double)((ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * (long)dVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
  return;
}

Assistant:

virtual void Check(HashMap<DATA_LEN> mp, Abstract<DATA_LEN>* another, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = abs((Query(it->first, mp) - another->Query(it->first, mp)));
			if (abs(it->second) > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		// cout << all << " " << size << endl;
		// cout << this->cr << " " << this->pr << endl;
	}